

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O2

bool pd::readPhrases(string *dir_name,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *phrases)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  reference p;
  ostream *poVar4;
  undefined1 local_2f0 [8];
  ifstream fi;
  uint auStack_2d0 [122];
  string local_e8 [8];
  string cur_filename;
  string local_a8 [8];
  path targetDir;
  string line;
  directory_iterator local_60;
  directory_iterator it;
  directory_iterator eod;
  directory_iterator local_40;
  directory_iterator local_38;
  
  line.field_2._8_8_ = phrases;
  std::__cxx11::string::string(local_a8,(string *)dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&local_60,(path *)local_a8,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_2f0 = (undefined1  [8])local_60.m_imp.px;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
    if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
      UNLOCK();
    }
  }
  _fi = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             local_2f0);
  boost::foreach_detail_::
  begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
            ((auto_any_t)&local_38,
             (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
              *)&eod,(true_ *)0x0);
  boost::foreach_detail_::
  end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
            ((auto_any_t)&local_40,
             (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
              *)&eod,(true_ *)0x0);
  bVar2 = true;
  do {
    if ((!bVar2) ||
       (bVar2 = boost::filesystem::directory_iterator::equal(&local_38,&local_40), bVar2)) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
      bVar2 = true;
LAB_00112c6d:
      std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
                ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>
                  *)&eod);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_60.m_imp);
      std::__cxx11::string::~string(local_a8);
      return bVar2;
    }
    p = boost::filesystem::directory_iterator::dereference(&local_38);
    bVar2 = false;
    while (!bVar2) {
      bVar3 = boost::filesystem::is_regular_file((path *)p);
      bVar2 = true;
      if (bVar3) {
        boost::filesystem::path::extension();
        bVar3 = boost::filesystem::operator==((path *)local_2f0,"swp");
        std::__cxx11::string::~string((string *)local_2f0);
        if (!bVar3) {
          std::ifstream::ifstream((string *)local_2f0,(string *)p,_S_in);
          uVar1 = *(uint *)((long)auStack_2d0 + *(long *)((long)local_2f0 + -0x18));
          if ((uVar1 & 5) == 0) {
            targetDir.m_pathname.field_2._8_8_ = &line._M_string_length;
            line._M_dataplus._M_p = (pointer)0x0;
            line._M_string_length._0_1_ = 0;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_2f0,
                       (string *)(targetDir.m_pathname.field_2._M_local_buf + 8));
            boost::filesystem::path::filename();
            std::__cxx11::string::string(local_e8,(string *)(cur_filename.field_2._M_local_buf + 8))
            ;
            std::__cxx11::string::~string((string *)(cur_filename.field_2._M_local_buf + 8));
            std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x6);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)line.field_2._8_8_,local_e8,
                       (undefined1 *)((long)&targetDir.m_pathname.field_2 + 8));
            std::__cxx11::string::~string(local_e8);
            std::__cxx11::string::~string((string *)(targetDir.m_pathname.field_2._M_local_buf + 8))
            ;
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
            poVar4 = std::operator<<(poVar4,(string *)p);
            poVar4 = std::operator<<(poVar4,"doesn\'t exist");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          std::ifstream::~ifstream(local_2f0);
          if ((uVar1 & 5) != 0) {
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_40.m_imp);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_38.m_imp);
            bVar2 = false;
            goto LAB_00112c6d;
          }
        }
      }
    }
    boost::filesystem::directory_iterator::increment(&local_38);
  } while( true );
}

Assistant:

bool readPhrases(const std::string& dir_name, std::unordered_map<std::string, std::string>& phrases)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::getline(fi, line);
                std::string cur_filename = p.filename().string();
                cur_filename.replace(0, 6, "words");
                phrases.emplace(cur_filename, line);
            } 
        }
        return true;
    }